

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

word Nf_MatchRef_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,int Required,Vec_Int_t *vBackup)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  word wVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  word *pwVar10;
  byte bVar11;
  uint uVar12;
  bool bVar13;
  word local_50;
  
  uVar12 = *(uint *)pM;
  if (-1 < (int)uVar12) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x6b9,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)")
    ;
  }
  if (Required < pM->D) {
    __assert_fail("pM->D <= Required",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x6ba,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)")
    ;
  }
  if ((uVar12 >> 0x1e & 1) == 0) {
    if ((i < 0) || ((p->vCutSets).nSize <= i)) {
LAB_007927e1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = (p->vCutSets).pArray[(uint)i];
    if (iVar2 == 0) {
      return 0;
    }
    uVar9 = iVar2 >> 0x10;
    if (((int)uVar9 < 0) || ((p->vPages).nSize <= (int)uVar9)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar7 = uVar12 >> 0x14 & 0x3ff;
    if (uVar7 == 0) {
      __assert_fail("h > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0x94,"int *Nf_CutFromHandle(int *, int)");
    }
    pvVar4 = (p->vPages).pArray[uVar9];
    bVar11 = 0;
    if ((*(byte *)((long)pvVar4 + (ulong)uVar7 * 4 + (ulong)(ushort)iVar2 * 4) & 0x1f) == 0) {
      local_50 = 0;
    }
    else {
      puVar1 = (uint *)((long)pvVar4 + (ulong)uVar7 * 4 + (ulong)(ushort)iVar2 * 4);
      uVar8 = 0;
      local_50 = 0;
      do {
        uVar12 = *(uint *)pM;
        uVar9 = puVar1[(ulong)(((uint)pM->Cfg >> 8) >> (bVar11 & 0x1f) & 0xf) + 1];
        if ((ulong)uVar9 == 0) goto LAB_007927b5;
        bVar13 = (((uint)pM->Cfg >> 1 & 0x7f) >> ((uint)uVar8 & 0x1f) & 1) != 0;
        iVar2 = *(int *)((long)p->pCells->iDelays + uVar8 * 4 + (ulong)((uVar12 & 0xfffff) * 0x50));
        if (vBackup == (Vec_Int_t *)0x0) {
          if ((int)uVar9 < 0) goto LAB_00792800;
          uVar12 = (uint)bVar13 + uVar9 * 2;
        }
        else {
          if ((int)uVar9 < 0) goto LAB_00792800;
          uVar12 = (uint)bVar13 + uVar9 * 2;
          Vec_IntPush(vBackup,uVar12);
        }
        if ((p->vMapRefs).nSize <= (int)uVar12) goto LAB_007927e1;
        piVar5 = (p->vMapRefs).pArray;
        iVar3 = piVar5[uVar12];
        if (iVar3 < 0) {
          __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                        ,0x6cd,
                        "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)");
        }
        piVar5[uVar12] = iVar3 + 1;
        if (iVar3 == 0) {
          wVar6 = Nf_MatchRef_rec(p,uVar9,(uint)bVar13,p->pNfObjs[uVar9].M[bVar13],Required - iVar2,
                                  vBackup);
          local_50 = local_50 + wVar6;
        }
        uVar8 = uVar8 + 1;
        bVar11 = bVar11 + 4;
      } while (uVar8 < (*puVar1 & 0x1f));
      uVar12 = *(uint *)pM;
    }
LAB_007927b5:
    pwVar10 = (word *)((long)p->pCells->iDelays + ((ulong)((uVar12 & 0xfffff) * 0x50) - 0x14));
  }
  else {
    iVar2 = p->InvDelayI;
    if (vBackup == (Vec_Int_t *)0x0) {
      if (i < 0) goto LAB_00792800;
    }
    else {
      if (i < 0) {
LAB_00792800:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(vBackup,(uint)(c == 0) + i * 2);
    }
    uVar12 = i * 2 | (uint)(c == 0);
    if ((p->vMapRefs).nSize <= (int)uVar12) goto LAB_007927e1;
    piVar5 = (p->vMapRefs).pArray;
    iVar3 = piVar5[uVar12];
    if (iVar3 < 0) {
      __assert_fail("Nf_ObjMapRefNum(p, i, !c) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0x6c0,
                    "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)");
    }
    piVar5[uVar12] = iVar3 + 1;
    if (iVar3 == 0) {
      local_50 = Nf_MatchRef_rec(p,i,(uint)(c == 0),p->pNfObjs[(uint)i].M[c == 0],Required - iVar2,
                                 vBackup);
    }
    else {
      local_50 = 0;
    }
    pwVar10 = &p->InvAreaW;
  }
  return local_50 + *pwVar10;
}

Assistant:

word Nf_MatchRef_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, int Required, Vec_Int_t * vBackup )
{
    word Area = 0;
    int ReqFanin;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    assert( pM->D <= Required );
    if ( pM->fCompl )
    {
        ReqFanin = Required - p->InvDelayI;
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(i, !c) );
        assert( Nf_ObjMapRefNum(p, i, !c) >= 0 );
        if ( !Nf_ObjMapRefInc(p, i, !c) )
            Area += Nf_MatchRef_rec( p, i, !c, Nf_ObjMatchD(p, i, !c), ReqFanin, vBackup );
        return Area + p->InvAreaW;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        ReqFanin = Required - Nf_ManCell(p, pM->Gate)->iDelays[k];
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(iVar, fCompl) );
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) >= 0 );
        if ( !Nf_ObjMapRefInc(p, iVar, fCompl) )
            Area += Nf_MatchRef_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl), ReqFanin, vBackup );
    }
    return Area + Nf_ManCell(p, pM->Gate)->AreaW;
}